

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETestSuite.cpp
# Opt level: O0

bool __thiscall
CETestSuite::test_vect_<double>
          (CETestSuite *this,vector<double,_std::allocator<double>_> *value,
          vector<double,_std::allocator<double>_> *expected,double *tol,string *function,int *line)

{
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  double *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long *in_RDI;
  double diff;
  double rel_tol;
  int i;
  bool isMatch;
  int *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  string *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  CETestSuite *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  string local_180 [12];
  int in_stack_fffffffffffffe8c;
  undefined1 local_159 [33];
  string local_138 [48];
  undefined1 local_108 [64];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  double local_48;
  double local_40;
  int local_38;
  byte local_31 [17];
  double *local_20;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_31[0] = 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::vector<double,_std::allocator<double>_>::size(in_RSI);
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::vector<double,_std::allocator<double>_>::size(local_18);
  if (__rhs == pbVar2) {
    for (local_38 = 0; uVar3 = (ulong)local_38,
        sVar4 = std::vector<double,_std::allocator<double>_>::size(local_10), uVar3 < sVar4;
        local_38 = local_38 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_38);
      local_40 = ABS(*pvVar5 * *local_20);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_38);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_38);
      local_48 = ABS(dVar1 - *pvVar5);
      if (local_40 < local_48) {
        in_stack_fffffffffffffe50 = (CETestSuite *)local_108;
        std::__cxx11::to_string(in_stack_fffffffffffffe8c);
        std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
        std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
        std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
        std::__cxx11::to_string((double)in_stack_fffffffffffffe48);
        std::operator+(in_stack_fffffffffffffe78,__rhs);
        std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
        log_failure(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                    in_stack_fffffffffffffe38);
        std::__cxx11::string::~string(local_68);
        std::__cxx11::string::~string(local_88);
        std::__cxx11::string::~string(local_138);
        std::__cxx11::string::~string(local_a8);
        std::__cxx11::string::~string(local_c8);
        std::__cxx11::string::~string((string *)(local_108 + 0x20));
        std::__cxx11::string::~string((string *)local_108);
        local_31[0] = 0;
      }
    }
    if ((local_31[0] & 1) != 0) {
      psVar6 = (string *)local_159;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_159 + 1),"VECTOR values and lengths ARE equal.",
                 (allocator *)psVar6);
      log_success(in_stack_fffffffffffffe50,psVar6,in_stack_fffffffffffffe40,
                  in_stack_fffffffffffffe38);
      std::__cxx11::string::~string((string *)(local_159 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_159);
    }
  }
  else {
    psVar6 = (string *)&stack0xfffffffffffffe7f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"VECTOR lengths are NOT equal.",(allocator *)psVar6);
    log_failure(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,psVar6,in_stack_fffffffffffffe38
               );
    std::__cxx11::string::~string(local_180);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe7f);
  }
  (**(code **)(*in_RDI + 0x78))(in_RDI,local_31);
  return (bool)(local_31[0] & 1);
}

Assistant:

bool CETestSuite::test_vect_(const std::vector<T>& value,
                             const std::vector<T>& expected,
                             const T&           tol,
                             const std::string& function,
                             const int&         line)
{
    bool isMatch = true;
    if (value.size() == expected.size()) {
        for (int i=0; i<value.size(); i++) {
            T rel_tol = std::fabs(expected[i] * tol);
            T diff    = std::fabs(value[i] - expected[i]);
            if (diff > rel_tol) {
                log_failure("VECTOR values at index "+std::to_string(i)+" " +
                            "are NOT equal (difference = " + 
                            std::to_string(diff) + ")", function, line);
                isMatch = false;
            }
        }

        // If there is a match, then we consider the vectors to be equal
        if (isMatch) {
            log_success("VECTOR values and lengths ARE equal.", function, line);
        }
    } else {
        log_failure("VECTOR lengths are NOT equal.", function, line);
    }

    update_pass(isMatch);
    return isMatch;
}